

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_short,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,unsigned_short *params,char (*params_1) [2])

{
  CappedArray<char,_8UL> local_38;
  CappedArray<char,_8UL> local_28;
  
  local_28 = toCharSequence<unsigned_short>((unsigned_short *)this);
  local_38 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[2]>((char (*) [2])params);
  _::concat<kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,(ArrayPtr<const_char> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}